

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O1

void * Abc_NodeGetCutsRecursive(void *p,Abc_Obj_t *pObj,int fDag,int fTree)

{
  Cut_Cut_t *pCVar1;
  void *pvVar2;
  
  pCVar1 = Cut_NodeReadCutsNew((Cut_Man_t *)p,pObj->Id);
  if (pCVar1 != (Cut_Cut_t *)0x0) {
    return pCVar1;
  }
  Abc_NodeGetCutsRecursive
            (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],fDag,fTree);
  Abc_NodeGetCutsRecursive
            (p,(Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]],fDag,fTree);
  pvVar2 = Abc_NodeGetCuts(p,pObj,fDag,fTree);
  return pvVar2;
}

Assistant:

void * Abc_NodeGetCutsRecursive( void * p, Abc_Obj_t * pObj, int fDag, int fTree )
{
    void * pList;
    if ( (pList = Abc_NodeReadCuts( p, pObj )) )
        return pList;
    Abc_NodeGetCutsRecursive( p, Abc_ObjFanin0(pObj), fDag, fTree );
    Abc_NodeGetCutsRecursive( p, Abc_ObjFanin1(pObj), fDag, fTree );
    return Abc_NodeGetCuts( p, pObj, fDag, fTree );
}